

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_errmsg16(sqlite3 *db)

{
  uint uVar1;
  int iVar2;
  char *zFormat;
  sqlite3 *in_RDI;
  void *z;
  sqlite3 *in_stack_ffffffffffffffd8;
  sqlite3 *db_00;
  u16 *local_18;
  u16 *local_8;
  
  if (in_RDI == (sqlite3 *)0x0) {
    local_8 = sqlite3_errmsg16::outOfMem;
  }
  else {
    iVar2 = sqlite3SafetyCheckSickOrOk(in_stack_ffffffffffffffd8);
    if (iVar2 == 0) {
      local_8 = sqlite3_errmsg16::misuse;
    }
    else {
      sqlite3_mutex_enter((sqlite3_mutex *)0x14cc23);
      if (in_RDI->mallocFailed == '\0') {
        local_18 = (u16 *)sqlite3_value_text16((sqlite3_value *)0x14cc4d);
        if (local_18 == (u16 *)0x0) {
          uVar1 = in_RDI->errCode;
          db_00 = in_RDI;
          zFormat = sqlite3ErrStr(in_RDI->errCode);
          sqlite3ErrorWithMsg(db_00,(int)(ulong)uVar1,zFormat);
          local_18 = (u16 *)sqlite3_value_text16((sqlite3_value *)0x14cc9f);
        }
        sqlite3OomClear(in_RDI);
      }
      else {
        local_18 = sqlite3_errmsg16::outOfMem;
      }
      sqlite3_mutex_leave((sqlite3_mutex *)0x14ccbc);
      local_8 = local_18;
    }
  }
  return local_8;
}

Assistant:

SQLITE_API const void *sqlite3_errmsg16(sqlite3 *db){
  static const u16 outOfMem[] = {
    'o', 'u', 't', ' ', 'o', 'f', ' ', 'm', 'e', 'm', 'o', 'r', 'y', 0
  };
  static const u16 misuse[] = {
    'b', 'a', 'd', ' ', 'p', 'a', 'r', 'a', 'm', 'e', 't', 'e', 'r', ' ',
    'o', 'r', ' ', 'o', 't', 'h', 'e', 'r', ' ', 'A', 'P', 'I', ' ',
    'm', 'i', 's', 'u', 's', 'e', 0
  };

  const void *z;
  if( !db ){
    return (void *)outOfMem;
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return (void *)misuse;
  }
  sqlite3_mutex_enter(db->mutex);
  if( db->mallocFailed ){
    z = (void *)outOfMem;
  }else{
    z = sqlite3_value_text16(db->pErr);
    if( z==0 ){
      sqlite3ErrorWithMsg(db, db->errCode, sqlite3ErrStr(db->errCode));
      z = sqlite3_value_text16(db->pErr);
    }
    /* A malloc() may have failed within the call to sqlite3_value_text16()
    ** above. If this is the case, then the db->mallocFailed flag needs to
    ** be cleared before returning. Do this directly, instead of via
    ** sqlite3ApiExit(), to avoid setting the database handle error message.
    */
    sqlite3OomClear(db);
  }
  sqlite3_mutex_leave(db->mutex);
  return z;
}